

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GetTextureSubImage::Functional::check(Functional *this,GLenum target,bool is_compressed)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  undefined4 *puVar3;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  uint uVar5;
  Enum<int,_2UL> EVar6;
  GLubyte local_26d;
  Enum<int,_2UL> local_230;
  char *local_220 [3];
  MessageBuilder local_208;
  GLubyte local_82;
  GLubyte local_81;
  uint local_80;
  GLubyte tested_value;
  uint uStack_7c;
  GLubyte reference_value;
  GLuint tested_data_position;
  GLuint reference_data_position;
  GLint c;
  GLint i;
  GLint j;
  GLint k;
  bool is_ok;
  void *pvStack_60;
  GLint error;
  GLubyte *texture_data;
  GLint y_block;
  GLint x_block;
  GLsizei size;
  GLint number_of_components;
  GLint depth;
  GLint z_offset;
  GLint height;
  GLint y_offset;
  GLint width;
  GLint x_offset;
  Functions *gl;
  bool is_compressed_local;
  Functional *pFStack_20;
  GLenum target_local;
  Functional *this_local;
  
  gl._3_1_ = is_compressed;
  gl._4_4_ = target;
  pFStack_20 = this;
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _width = CONCAT44(extraout_var,iVar1);
  y_offset = 4;
  height = 4;
  z_offset = 0;
  depth = 1;
  number_of_components = 0;
  size = 1;
  if (gl._4_4_ != 0xde0) {
    z_offset = 4;
    depth = 4;
  }
  if ((gl._4_4_ == 0x806f) || (gl._4_4_ == 0x8c1a)) {
    number_of_components = 4;
    size = 4;
  }
  if ((gl._4_4_ == 0x8513) || (gl._4_4_ == 0x9009)) {
    number_of_components = 3;
    size = 3;
  }
  if ((gl._3_1_ & 1) == 0) {
    x_block = 4;
  }
  else {
    x_block = 8;
  }
  texture_data._4_4_ = 1;
  texture_data._0_4_ = 1;
  if ((gl._3_1_ & 1) == 0) {
    uVar5 = depth * 4;
  }
  else {
    texture_data._4_4_ = 4;
    texture_data._0_4_ = 4;
    uVar5 = (uint)depth / 4;
  }
  y_block = uVar5 * size * x_block;
  pvStack_60 = operator_new__((long)y_block);
  if (pvStack_60 == (void *)0x0) {
    puVar3 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar3 = 0;
    __cxa_throw(puVar3,&int::typeinfo,0);
  }
  if ((gl._3_1_ & 1) == 0) {
    (*this->m_gl_GetTextureSubImage)
              (this->m_texture,0,y_offset,z_offset,number_of_components,height,depth,size,0x1908,
               0x1401,y_block,pvStack_60);
  }
  else {
    (*this->m_gl_GetCompressedTextureSubImage)
              (this->m_texture,0,y_offset,z_offset,number_of_components,height,depth,size,y_block,
               pvStack_60);
  }
  k = (**(code **)(_width + 0x800))();
  j._3_1_ = 1;
  if (k != 0) {
    if (pvStack_60 != (void *)0x0) {
      operator_delete__(pvStack_60);
    }
    puVar3 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar3 = 0;
    __cxa_throw(puVar3,&int::typeinfo,0);
  }
  i = 0;
  do {
    if (size <= i) {
      if (pvStack_60 != (void *)0x0) {
        operator_delete__(pvStack_60);
      }
      if ((j._3_1_ & 1) == 0) {
        this_00 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_208,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<(&local_208,(char (*) [20])"Functional test of ");
        local_220[0] = "glGetTextureSubImage ";
        if ((gl._3_1_ & 1) != 0) {
          local_220[0] = "glGetCompressedTextureSubImage ";
        }
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_220);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (pMVar4,(char (*) [33])"function has failed with target ");
        EVar6 = glu::getTextureTargetStr(gl._4_4_);
        local_230.m_getName = EVar6.m_getName;
        local_230.m_value = EVar6.m_value;
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_230);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2b6cb9a);
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_208);
      }
      return (bool)(j._3_1_ & 1);
    }
    for (c = 0; c < depth / (int)texture_data; c = c + 1) {
      for (reference_data_position = 0; (int)reference_data_position < height / texture_data._4_4_;
          reference_data_position = reference_data_position + 1) {
        for (tested_data_position = 0; (int)tested_data_position < x_block;
            tested_data_position = tested_data_position + 1) {
          uStack_7c = (reference_data_position + y_offset / texture_data._4_4_) * x_block +
                      (((c + z_offset / (int)texture_data) * 8) / texture_data._4_4_) * x_block +
                      (((((i + number_of_components) * 8) / texture_data._4_4_) * 8) /
                      (int)texture_data) * x_block + tested_data_position;
          local_80 = reference_data_position * x_block +
                     ((c * height) / texture_data._4_4_) * x_block +
                     ((((i * height) / texture_data._4_4_) * depth) / (int)texture_data) * x_block +
                     tested_data_position;
          if ((gl._3_1_ & 1) == 0) {
            local_26d = ""[uStack_7c];
          }
          else {
            local_26d = s_texture_data_compressed[uStack_7c];
          }
          local_81 = local_26d;
          local_82 = *(GLubyte *)((long)pvStack_60 + (ulong)local_80);
          if (local_26d != local_82) {
            j._3_1_ = 0;
            break;
          }
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

bool gl4cts::GetTextureSubImage::Functional::check(glw::GLenum target, bool is_compressed)
{
	/* OpenGL functions access point. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Arguments setup (depends on dimmension) */
	glw::GLint x_offset = s_texture_data_width / 2 /* half */;
	glw::GLint width	= s_texture_data_width / 2 /* half */;

	glw::GLint y_offset = 0;
	glw::GLint height   = 1;

	glw::GLint z_offset = 0;
	glw::GLint depth	= 1;

	/* For 2 and 3 -dimensional textures setup y-direction. */
	if (GL_TEXTURE_1D != target)
	{
		y_offset = s_texture_data_height / 2 /* half */;
		height   = s_texture_data_height / 2 /* half */;
	}

	/* For 3-dimensional textures setup z-direction. */
	if ((GL_TEXTURE_3D == target) || (GL_TEXTURE_2D_ARRAY == target))
	{
		z_offset = s_texture_data_depth / 2 /* half */;
		depth	= s_texture_data_depth / 2 /* half */;
	}

	/* For cube-map texture stup 6-cube faces. */
	if ((GL_TEXTURE_CUBE_MAP == target) || (GL_TEXTURE_CUBE_MAP_ARRAY == target))
	{
		z_offset = 3; /* half of cube map */
		depth	= 3; /* half of cube map */
	}

	/* Setup number of components. */
	glw::GLint number_of_components = 0;

	if (is_compressed)
	{
		number_of_components = 8; /* 64 bit block of 4x4 compressed pixels. */
	}
	else
	{
		number_of_components = 4; /* RGBA components. */
	}

	/* Setup size. */
	glw::GLsizei size = 0;

	/* Iterate over pixels. */
	glw::GLint x_block = 1;
	glw::GLint y_block = 1;

	if (is_compressed)
	{
		/* Iterate over 4x4 compressed pixel block. */
		x_block = 4;
		y_block = 4;

		size = static_cast<glw::GLsizei>((width / x_block) * (height / y_block) * depth * number_of_components *
										 sizeof(glw::GLubyte));
	}
	else
	{
		size = static_cast<glw::GLsizei>(width * height * depth * number_of_components * sizeof(glw::GLubyte));
	}

	/* Storage for fetched texturte. */
	glw::GLubyte* texture_data = new glw::GLubyte[size];

	if (DE_NULL == texture_data)
	{
		throw 0;
	}

	/* Fetching texture. */
	if (is_compressed)
	{
		m_gl_GetCompressedTextureSubImage(m_texture, 0, x_offset, y_offset, z_offset, width, height, depth, size,
										  texture_data);
	}
	else
	{
		m_gl_GetTextureSubImage(m_texture, 0, x_offset, y_offset, z_offset, width, height, depth, GL_RGBA,
								GL_UNSIGNED_BYTE, size, texture_data);
	}

	/* Comprae fetched texture with reference. */
	glw::GLint error = gl.getError();

	bool is_ok = true;

	if (GL_NO_ERROR == error)
	{
		for (glw::GLint k = 0; k < depth; ++k)
		{
			for (glw::GLint j = 0; j < height / y_block; ++j)
			{
				for (glw::GLint i = 0; i < width / x_block; ++i)
				{
					for (glw::GLint c = 0; c < number_of_components; ++c) /* RGBA components iterating */
					{
						glw::GLuint reference_data_position =
							(i + (x_offset / x_block)) * number_of_components +
							(j + (y_offset / y_block)) * s_texture_data_width / x_block * number_of_components +
							(k + z_offset) * s_texture_data_width / x_block * s_texture_data_height / y_block *
								number_of_components +
							c;

						glw::GLuint tested_data_position =
							i * number_of_components + j * width / x_block * number_of_components +
							k * width / x_block * height / y_block * number_of_components + c;

						glw::GLubyte reference_value = (is_compressed) ?
														   s_texture_data_compressed[reference_data_position] :
														   s_texture_data[reference_data_position];
						glw::GLubyte tested_value = texture_data[tested_data_position];

						if (reference_value != tested_value)
						{
							is_ok = false;
							break;
						}
					}
				}
			}
		}
	}
	else
	{
		/* GL error. */
		delete[] texture_data;
		throw 0;
	}

	/* Cleanup. */
	delete[] texture_data;

	/* Error reporting. */
	if (!is_ok)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Functional test of "
						   << ((is_compressed) ? "glGetCompressedTextureSubImage " : "glGetTextureSubImage ")
						   << "function has failed with target " << glu::getTextureTargetStr(target) << "."
						   << tcu::TestLog::EndMessage;
	}

	/* Return result. */
	return is_ok;
}